

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall kratos::InsertClockIRVisitor::visit(InsertClockIRVisitor *this,Generator *gen)

{
  shared_ptr<kratos::Attribute> *psVar1;
  Generator *this_00;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar3;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  _Var4;
  iterator iVar5;
  undefined4 extraout_var;
  undefined1 left [8];
  undefined1 local_38 [8];
  shared_ptr<kratos::Port> parent_port;
  
  if ((((this->clk_en_ != (Port *)0x0) &&
       (psVar1 = (gen->super_IRNode).attributes_.
                 super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       _Var4 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Attribute>const*,std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>>,__gnu_cxx::__ops::_Iter_pred<kratos::InsertClockIRVisitor::has_don_touch(kratos::IRNode_const*)::_lambda(auto:1_const&)_1_>>
                         ((gen->super_IRNode).attributes_.
                          super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,psVar1),
       _Var4._M_current == psVar1)) &&
      ((gen->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (gen->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((((gen->is_external_ & 1U) == 0 && (gen->is_stub_ == false)) &&
      ((this_00 = gen->parent_generator_, this_00 != (Generator *)0x0 && (this->top_ != gen)))))) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(gen->ports_)._M_t,&this->clk_en_name_);
    if ((_Rb_tree_header *)iVar5._M_node == &(gen->ports_)._M_t._M_impl.super__Rb_tree_header) {
      left = (undefined1  [8])Generator::port(gen,this->clk_en_,true);
      if (((Port *)left)->type_ != ClockEnable) {
        (*(((Port *)left)->super_Var).super_IRNode._vptr_IRNode[0x2b])(left,4);
      }
    }
    else {
      Generator::get_port((Generator *)local_38,(string *)gen);
      left = local_38;
      if (parent_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   parent_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      iVar3 = (*(((Var *)left)->super_IRNode)._vptr_IRNode[0x10])(left);
      if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x18) != 0) {
        lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x10);
        if (*(int *)(*(long *)(*(long *)(lVar2 + 8) + 200) + 0x168) != 3) {
          return;
        }
        this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x10);
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        (*(((Var *)left)->super_IRNode)._vptr_IRNode[0x12])(left,1);
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
    Generator::get_port((Generator *)local_38,(string *)this_00);
    Generator::wire(this_00,(Var *)left,(Var *)local_38);
    if (parent_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 parent_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return;
}

Assistant:

void visit(Generator* gen) override {
        if (!clk_en_) return;
        if (has_don_touch(gen)) return;
        if (gen->external() || gen->is_stub()) return;
        auto* parent = gen->parent_generator();
        if (!parent || gen == top_) return;

        Port* clk_en;
        if (!gen->has_port(clk_en_name_)) {
            clk_en = &gen->port(*clk_en_);
            if (clk_en->port_type() != PortType::ClockEnable)
                clk_en->set_port_type(PortType::ClockEnable);
        } else {
            clk_en = gen->get_port(clk_en_name_).get();
            // notice that if it's being wired to a constant, we need to disconnect it
            auto const& sources = clk_en->sources();
            if (!sources.empty()) {
                if ((*(sources.begin()))->right()->type() == VarType::ConstValue) {
                    auto stmt = *(sources.begin());
                    clk_en->clear_sources(true);
                } else {
                    // no need to wire
                    return;
                }
            }
        }
        // wire to the top
        auto parent_port = parent->get_port(clk_en_name_);
        parent->wire(*clk_en, *parent_port);
    }